

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O1

void HBLAS2::hblas2_ger_square<std::complex<double>,true>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  pointer pqVar13;
  quaternion<double> *__cur;
  void *__s;
  quaternion<double> *X;
  long lVar14;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  pointer pqVar15;
  quaternion<double> *pqVar16;
  long lVar17;
  quaternion<double> *x;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar32 [16];
  ulong uVar29;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar30;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar39 [16];
  double dVar31;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  complex<double> ALPHA;
  quaternion<double> *in_stack_fffffffffffffcd8;
  double dVar108;
  double local_308;
  double local_2d8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> AC;
  undefined1 local_230 [8];
  undefined8 local_228;
  shared_count sStack_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined **local_1d8;
  undefined1 local_1d0;
  undefined8 *local_1c8;
  char **local_1c0;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar71 [32];
  undefined1 auVar92 [32];
  undefined1 auVar102 [32];
  undefined1 auVar105 [32];
  
  __s = operator_new(0xc80);
  memset(__s,0,0xc80);
  X = (quaternion<double> *)operator_new(0xc80);
  memset(X,0,0xc80);
  A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(320000);
  pqVar15 = A.
            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 10000;
  A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = pqVar15;
  memset(A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start,0,320000);
  lVar18 = 0x18;
  A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = pqVar15;
  do {
    dVar24 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar31 = _ZL3dis_0;
    dVar28 = _ZL3dis_1;
    dVar25 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar108 = _ZL3dis_1;
    dVar30 = _ZL3dis_0;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar27 = _ZL3dis_1;
    dVar11 = _ZL3dis_0;
    auVar42._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    auVar42._8_56_ = extraout_var;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar31;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar24;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar28 - dVar31;
    auVar20 = vfmadd132sd_fma(auVar45,auVar62,auVar20);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar30;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar25;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = dVar108 - dVar30;
    auVar1 = vfmadd132sd_fma(auVar63,auVar73,auVar1);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = dVar11;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar26;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar27 - dVar11;
    auVar2 = vfmadd132sd_fma(auVar74,auVar82,auVar2);
    auVar94._8_8_ = 0;
    auVar94._0_8_ = _ZL3dis_0;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = _ZL3dis_1 - _ZL3dis_0;
    auVar45 = vfmadd213sd_fma(auVar83,auVar42._0_16_,auVar94);
    *(long *)((long)__s + lVar18 + -0x18) = auVar20._0_8_;
    *(long *)((long)__s + lVar18 + -0x10) = auVar1._0_8_;
    *(long *)((long)__s + lVar18 + -8) = auVar2._0_8_;
    *(long *)((long)__s + lVar18) = auVar45._0_8_;
    lVar18 = lVar18 + 0x20;
  } while (lVar18 != 0xc98);
  lVar18 = 0x18;
  do {
    dVar24 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar31 = _ZL3dis_0;
    dVar28 = _ZL3dis_1;
    dVar25 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar108 = _ZL3dis_1;
    dVar30 = _ZL3dis_0;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar27 = _ZL3dis_1;
    dVar11 = _ZL3dis_0;
    auVar43._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    pqVar13 = A.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    auVar43._8_56_ = extraout_var_00;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar31;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar24;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar28 - dVar31;
    auVar20 = vfmadd132sd_fma(auVar46,auVar64,auVar3);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar30;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar25;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar108 - dVar30;
    auVar1 = vfmadd132sd_fma(auVar65,auVar75,auVar4);
    auVar84._8_8_ = 0;
    auVar84._0_8_ = dVar11;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar26;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar27 - dVar11;
    auVar2 = vfmadd132sd_fma(auVar76,auVar84,auVar5);
    auVar95._8_8_ = 0;
    auVar95._0_8_ = _ZL3dis_0;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = _ZL3dis_1 - _ZL3dis_0;
    auVar45 = vfmadd213sd_fma(auVar85,auVar43._0_16_,auVar95);
    *(long *)((long)X + lVar18 + -0x18) = auVar20._0_8_;
    *(long *)((long)X + lVar18 + -0x10) = auVar1._0_8_;
    *(long *)((long)X + lVar18 + -8) = auVar2._0_8_;
    *(long *)((long)&X->_M_real + lVar18) = auVar45._0_8_;
    lVar18 = lVar18 + 0x20;
    pqVar15 = A.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  } while (lVar18 != 0xc98);
  for (; pqVar15 != pqVar13; pqVar15 = pqVar15 + 1) {
    dVar24 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar31 = _ZL3dis_0;
    dVar28 = _ZL3dis_1;
    dVar25 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar108 = _ZL3dis_1;
    dVar30 = _ZL3dis_0;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar27 = _ZL3dis_1;
    dVar11 = _ZL3dis_0;
    auVar44._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    auVar44._8_56_ = extraout_var_01;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar31;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar24;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar28 - dVar31;
    auVar20 = vfmadd132sd_fma(auVar47,auVar66,auVar6);
    auVar77._8_8_ = 0;
    auVar77._0_8_ = dVar30;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar25;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar108 - dVar30;
    auVar1 = vfmadd132sd_fma(auVar67,auVar77,auVar7);
    auVar86._8_8_ = 0;
    auVar86._0_8_ = dVar11;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar26;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = dVar27 - dVar11;
    auVar2 = vfmadd132sd_fma(auVar78,auVar86,auVar8);
    auVar96._8_8_ = 0;
    auVar96._0_8_ = _ZL3dis_0;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = _ZL3dis_1 - _ZL3dis_0;
    auVar45 = vfmadd213sd_fma(auVar87,auVar44._0_16_,auVar96);
    pqVar15->_M_real = auVar20._0_8_;
    pqVar15->_M_imag_i = auVar1._0_8_;
    pqVar15->_M_imag_j = auVar2._0_8_;
    pqVar15->_M_imag_k = auVar45._0_8_;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&AC,&A);
  dVar27 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar31 = _ZL3dis_0;
  dVar108 = _ZL3dis_1;
  dVar28 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar11 = _ZL3dis_1;
  dVar30 = _ZL3dis_0;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"hblas2_ger ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"c",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_square_",8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"C",1);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar31;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar27;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar108 - dVar31;
  auVar20 = vfmadd132sd_fma(auVar32,auVar48,auVar9);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar30;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar28;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar11 - dVar30;
  auVar1 = vfmadd132sd_fma(auVar49,auVar79,auVar10);
  uVar29 = auVar20._0_8_;
  ALPHA._M_value._8_8_ = 1;
  ALPHA._M_value._0_8_ = __s;
  HAXX::HBLAS_GERC<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>>
            (100,100,ALPHA,X,1,
             A.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,100,in_stack_fffffffffffffcd8,auVar20._0_4_);
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar20 = vxorpd_avx512vl(auVar1,auVar12);
  lVar18 = 0x18;
  lVar17 = 0;
  do {
    pqVar16 = X + lVar17;
    lVar19 = 0x18;
    lVar14 = lVar18;
    do {
      local_1e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
      local_1e0 = "";
      local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0xf5,&local_1f8);
      pqVar15 = A.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar31 = *(double *)((long)__s + lVar19 + -0x18);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar31;
      dVar30 = *(double *)((long)__s + lVar19 + -0x10);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar30;
      local_2d8 = auVar20._0_8_;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar29;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = dVar30 * local_2d8;
      auVar2 = vfmadd231sd_fma(auVar68,auVar99,auVar33);
      local_308 = auVar1._0_8_;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_308 * dVar31;
      auVar45 = vfmadd231sd_fma(auVar34,auVar99,auVar50);
      dVar31 = *(double *)((long)__s + lVar19 + -8);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = dVar31;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = *(double *)((long)__s + lVar19);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = *(double *)((long)__s + lVar19) * local_2d8;
      auVar62 = vfmadd231sd_fma(auVar88,auVar99,auVar51);
      auVar69._0_8_ = auVar2._0_8_;
      auVar69._8_8_ = auVar69._0_8_;
      auVar71._16_8_ = auVar69._0_8_;
      auVar71._0_16_ = auVar69;
      auVar71._24_8_ = auVar69._0_8_;
      auVar35._0_8_ = auVar45._0_8_;
      auVar35._8_8_ = auVar35._0_8_;
      auVar2 = vunpcklpd_avx(auVar69,auVar35);
      auVar89._0_8_ = auVar62._0_8_;
      auVar89._8_8_ = auVar89._0_8_;
      auVar23._16_16_ = auVar89;
      auVar23._0_16_ = auVar2;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_308 * dVar31;
      auVar2 = vfmadd231sd_fma(auVar52,auVar99,auVar80);
      auVar53._0_8_ = auVar2._0_8_;
      auVar53._8_8_ = auVar53._0_8_;
      auVar22._16_8_ = auVar53._0_8_;
      auVar22._0_16_ = auVar53;
      auVar22._24_8_ = auVar53._0_8_;
      auVar22 = vblendpd_avx(auVar23,auVar22,8);
      auVar97._0_8_ = -pqVar16->_M_imag_i;
      auVar97._8_8_ = 0x8000000000000000;
      auVar100._0_8_ = -pqVar16->_M_imag_j;
      auVar100._8_8_ = 0x8000000000000000;
      auVar21._0_8_ = -pqVar16->_M_imag_k;
      dVar31 = pqVar16->_M_real;
      auVar104._8_8_ = dVar31;
      auVar104._0_8_ = dVar31;
      auVar105._16_8_ = dVar31;
      auVar105._0_16_ = auVar104;
      auVar105._24_8_ = dVar31;
      auVar2 = vunpcklpd_avx(auVar104,auVar97);
      auVar106._16_16_ = auVar100;
      auVar106._0_16_ = auVar2;
      auVar21._8_8_ = auVar21._0_8_;
      auVar21._16_8_ = auVar21._0_8_;
      auVar21._24_8_ = auVar21._0_8_;
      auVar23 = vblendpd_avx(auVar106,auVar21,8);
      auVar58 = vshufpd_avx(auVar22,auVar22,0xb);
      auVar2 = vunpckhpd_avx(auVar53,auVar35);
      auVar40._16_16_ = auVar2;
      auVar40._0_16_ = auVar89;
      auVar21 = vblendpd_avx(auVar105,ZEXT1632(auVar97),1);
      auVar2 = vunpcklpd_avx(auVar97,auVar100);
      auVar91._16_16_ = auVar2;
      auVar91._0_16_ = auVar23._16_16_;
      auVar57._0_8_ = auVar58._0_8_ * auVar21._0_8_;
      auVar57._8_8_ = auVar58._8_8_ * auVar21._8_8_;
      auVar57._16_8_ = auVar58._16_8_ * auVar21._16_8_;
      auVar57._24_8_ = auVar58._24_8_ * auVar21._24_8_;
      auVar2 = vfmadd231pd_fma(auVar57,auVar40,auVar91);
      auVar22 = vpermpd_avx2(auVar22,0x9f);
      auVar21 = vpermt2pd_avx512f(_DAT_00248800,ZEXT1632(auVar97));
      auVar58._0_8_ = auVar21._0_8_ * auVar22._0_8_;
      auVar58._8_8_ = auVar21._8_8_ * auVar22._8_8_;
      auVar58._16_8_ = auVar21._16_8_ * auVar22._16_8_;
      auVar58._24_8_ = auVar21._24_8_ * auVar22._24_8_;
      auVar45 = vfmsub231pd_fma(auVar58,auVar71,auVar23);
      auVar36._0_8_ = auVar45._0_8_ + -auVar2._0_8_;
      auVar36._8_8_ = auVar45._8_8_ + auVar2._8_8_;
      dVar11 = auVar36._0_8_ +
               *(double *)
                ((long)AC.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x18);
      auVar2 = vshufpd_avx(auVar36,auVar36,1);
      dVar31 = *(double *)
                ((long)AC.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x10);
      dVar108 = *(double *)
                 ((long)AC.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8) + 0.0;
      auVar45 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
      dVar27 = auVar45._0_8_ +
               *(double *)
                ((long)&(AC.
                         super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar14);
      dVar30 = *(double *)
                ((long)A.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x18);
      auVar54._8_8_ = 0;
      auVar54._0_8_ =
           *(ulong *)((long)A.
                            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x10);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar30 * dVar30;
      auVar45 = vfmadd231sd_fma(auVar37,auVar54,auVar54);
      auVar55._8_8_ = 0;
      auVar55._0_8_ =
           *(ulong *)((long)A.
                            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8);
      auVar45 = vfmadd213sd_fma(auVar55,auVar55,auVar45);
      auVar38._8_8_ = 0;
      auVar38._0_8_ =
           *(ulong *)((long)&(A.
                              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar14);
      auVar45 = vfmadd213sd_fma(auVar38,auVar38,auVar45);
      if (auVar45._0_8_ < 0.0) {
        dVar30 = sqrt(auVar45._0_8_);
      }
      else {
        auVar45 = vsqrtsd_avx(auVar45,auVar45);
        dVar30 = auVar45._0_8_;
      }
      auVar107._8_8_ = 0;
      auVar107._0_8_ = dVar11;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = auVar2._0_8_ + dVar31;
      auVar2 = vunpcklpd_avx(auVar107,auVar70);
      auVar59._8_8_ = dVar108;
      auVar59._0_8_ = dVar108;
      auVar59._16_8_ = dVar108;
      auVar59._24_8_ = dVar108;
      auVar22 = vblendpd_avx(ZEXT1632(auVar2),auVar59,4);
      auVar60._8_8_ = dVar27;
      auVar60._0_8_ = dVar27;
      auVar60._16_8_ = dVar27;
      auVar60._24_8_ = dVar27;
      auVar23 = vblendpd_avx(auVar22,auVar60,8);
      auVar90._0_8_ = (*(double *)((long)pqVar15 + lVar14 + -0x18) / dVar30) / dVar30;
      auVar98._0_8_ = (-*(double *)((long)pqVar15 + lVar14 + -0x10) / dVar30) / dVar30;
      auVar98._8_8_ = 0x8000000000000000;
      auVar90._8_8_ = auVar90._0_8_;
      auVar92._16_8_ = auVar90._0_8_;
      auVar92._0_16_ = auVar90;
      auVar92._24_8_ = auVar90._0_8_;
      auVar45 = vunpcklpd_avx(auVar90,auVar98);
      auVar101._0_8_ = (-*(double *)((long)pqVar15 + lVar14 + -8) / dVar30) / dVar30;
      auVar101._8_8_ = auVar101._0_8_;
      auVar102._16_8_ = auVar101._0_8_;
      auVar102._0_16_ = auVar101;
      auVar102._24_8_ = auVar101._0_8_;
      auVar21 = vblendpd_avx(ZEXT1632(auVar45),auVar102,4);
      auVar41._0_8_ = (-*(double *)((long)&pqVar15->_M_real + lVar14) / dVar30) / dVar30;
      auVar41._8_8_ = auVar41._0_8_;
      auVar41._16_8_ = auVar41._0_8_;
      auVar41._24_8_ = auVar41._0_8_;
      auVar21 = vblendpd_avx(auVar21,auVar41,8);
      auVar58 = vshufpd_avx(auVar23,auVar23,0xb);
      auVar2 = vunpckhpd_avx(auVar23._16_16_,auVar2);
      auVar81._8_8_ = auVar22._16_8_;
      auVar81._0_8_ = auVar22._16_8_;
      auVar81._16_16_ = auVar2;
      auVar2 = vunpcklpd_avx(auVar98,auVar90);
      auVar23 = vblendpd_avx(ZEXT1632(auVar2),auVar92,0xc);
      auVar2 = vunpcklpd_avx(auVar98,auVar101);
      auVar103._16_16_ = auVar2;
      auVar103._0_16_ = auVar21._16_16_;
      auVar93._0_8_ = auVar58._0_8_ * auVar23._0_8_;
      auVar93._8_8_ = auVar58._8_8_ * auVar23._8_8_;
      auVar93._16_8_ = auVar58._16_8_ * auVar23._16_8_;
      auVar93._24_8_ = auVar58._24_8_ * auVar23._24_8_;
      auVar2 = vfmadd231pd_fma(auVar93,auVar81,auVar103);
      auVar22 = vpermt2pd_avx512f(_DAT_002494e0,auVar22);
      auVar72._8_8_ = dVar11;
      auVar72._0_8_ = dVar11;
      auVar72._16_8_ = dVar11;
      auVar72._24_8_ = dVar11;
      auVar23 = vpermt2pd_avx512f(_DAT_00248800,ZEXT1632(auVar98));
      auVar61._0_8_ = auVar23._0_8_ * auVar22._0_8_;
      auVar61._8_8_ = auVar23._8_8_ * auVar22._8_8_;
      auVar61._16_8_ = auVar23._16_8_ * auVar22._16_8_;
      auVar61._24_8_ = auVar23._24_8_ * auVar22._24_8_;
      auVar45 = vfmsub231pd_fma(auVar61,auVar21,auVar72);
      auVar39._0_8_ = auVar45._0_8_ + -auVar2._0_8_;
      auVar39._8_8_ = auVar45._8_8_ + auVar2._8_8_;
      auVar2 = vshufpd_avx(auVar39,auVar39,1);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = (auVar39._0_8_ + -1.0) * (auVar39._0_8_ + -1.0);
      auVar2 = vfmadd213sd_fma(auVar2,auVar2,auVar56);
      auVar45 = vfmadd231sd_fma(auVar2,(undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar2 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
      auVar2 = vfmadd213sd_fma(auVar2,auVar2,auVar45);
      if (auVar2._0_8_ < 0.0) {
        dVar31 = sqrt(auVar2._0_8_);
      }
      else {
        auVar2 = vsqrtsd_avx(auVar2,auVar2);
        dVar31 = auVar2._0_8_;
      }
      local_230[0] = dVar31 < 1e-12;
      local_228 = 0;
      sStack_220.pi_ = (sp_counted_base *)0x0;
      local_208 = 
      "( HAXX::norm(((ALPHA*X[i]*HAXX::conj(Y[j]) + AC[( (i) + (j)*(100) )]) * HAXX::inv(A[( (i) + (j)*(100) )]))- 1.) < 1e-12 )"
      ;
      local_200 = "";
      local_1d0 = 0;
      local_1d8 = &PTR__lazy_ostream_002698f0;
      local_1c8 = &boost::unit_test::lazy_ostream::inst;
      local_1c0 = &local_208;
      local_218 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
      local_210 = "";
      boost::test_tools::tt_detail::report_assertion(local_230,&local_1d8,&local_218,0xf5,1,0,0);
      boost::detail::shared_count::~shared_count(&sStack_220);
      lVar14 = lVar14 + 0x20;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0xc98);
    lVar17 = lVar17 + 1;
    lVar18 = lVar18 + 0xc80;
  } while (lVar17 != 100);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  if (AC.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(AC.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)AC.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)AC.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(A.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)A.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)A.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(X,0xc80);
  operator_delete(__s,0xc80);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(hblas2_gemv_square_CQR_LDSame) {
  hblas2_gemv_square_LDSame<HAXX::quaternion<double>,double,'C'>(); 
}